

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderRenderingPointsCase::getFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderRenderingPointsCase *this)

{
  int iVar1;
  allocator<char> local_19;
  GeometryShaderRenderingPointsCase *local_18;
  GeometryShaderRenderingPointsCase *this_local;
  
  local_18 = this;
  this_local = (GeometryShaderRenderingPointsCase *)__return_storage_ptr__;
  if (getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_,
                 "${VERSION}\n\nprecision highp float;\n\nin  vec4 gs_fs_color;\nout vec4 result;\n\nvoid main()\n{\n    result = gs_fs_color;\n}\n"
                 ,&local_19);
      std::allocator<char>::~allocator(&local_19);
      __cxa_atexit(std::__cxx11::string::~string,
                   &getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_);
    }
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderRenderingPointsCase::getFragmentShaderCode()
{
	static std::string fs_code = "${VERSION}\n"
								 "\n"
								 "precision highp float;\n"
								 "\n"
								 "in  vec4 gs_fs_color;\n"
								 "out vec4 result;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    result = gs_fs_color;\n"
								 "}\n";

	return fs_code;
}